

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O1

_Bool load_block(ang_file *f,blockheader *b,loader_t loader)

{
  int iVar1;
  _Bool _Var2;
  
  buffer = (uint8_t *)mem_alloc((ulong)b->size);
  _Var2 = false;
  buffer_pos = 0;
  buffer_check = 0;
  buffer_size = file_read(f,(char *)buffer,(ulong)b->size);
  if (buffer_size == b->size) {
    iVar1 = (*loader)();
    _Var2 = iVar1 == 0;
  }
  mem_free(buffer);
  return _Var2;
}

Assistant:

static bool load_block(ang_file *f, struct blockheader *b, loader_t loader)
{
	/* Allocate space for the buffer */
	buffer = mem_alloc(b->size);
	buffer_pos = 0;
	buffer_check = 0;

	buffer_size = file_read(f, (char *) buffer, b->size);
	if (buffer_size != b->size ||
			loader() != 0) {
		mem_free(buffer);
		return false;
	}

	mem_free(buffer);
	return true;
}